

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetectorOutput.h
# Opt level: O0

void __thiscall DetectorOutput::DetectorOutput(DetectorOutput *this,char *detector)

{
  uint uVar1;
  int iVar2;
  element_type *peVar3;
  runtime_error *prVar4;
  undefined4 extraout_var;
  Detector *__p;
  pointer pDVar5;
  char *local_48;
  char *_argv;
  ProcedurePtr local_38;
  _func_Detector_ptr *local_30;
  _func_Detector_ptr *create_detector;
  char *local_18;
  char *detector_local;
  DetectorOutput *this_local;
  
  local_18 = detector;
  detector_local = (char *)this;
  std::
  unordered_map<unsigned_int,_void_**,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_void_**>_>_>
  ::unordered_map(&this->tls);
  util::LibLoaderFactory::getLoader();
  std::unique_ptr<Detector,std::default_delete<Detector>>::
  unique_ptr<std::default_delete<Detector>,void>
            ((unique_ptr<Detector,std::default_delete<Detector>> *)&this->_det);
  peVar3 = std::__shared_ptr_access<util::LibraryLoader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<util::LibraryLoader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->_libdetector);
  uVar1 = (*peVar3->_vptr_LibraryLoader[2])(peVar3,local_18);
  if ((uVar1 & 1) == 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"could not load library");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar3 = std::__shared_ptr_access<util::LibraryLoader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<util::LibraryLoader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&this->_libdetector);
  iVar2 = (*peVar3->_vptr_LibraryLoader[5])(peVar3,"CreateDetector");
  local_38._ptr = (void *)CONCAT44(extraout_var,iVar2);
  local_30 = util::ProcedurePtr::operator_Detector_______<Detector_*(),_void>(&local_38);
  if (local_30 == (_func_Detector_ptr *)0x0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"could not bind detector");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __p = (*local_30)();
  std::unique_ptr<Detector,std::default_delete<Detector>>::
  unique_ptr<std::default_delete<Detector>,void>
            ((unique_ptr<Detector,std::default_delete<Detector>> *)&_argv,__p);
  std::unique_ptr<Detector,_std::default_delete<Detector>_>::operator=
            (&this->_det,(unique_ptr<Detector,_std::default_delete<Detector>_> *)&_argv);
  std::unique_ptr<Detector,_std::default_delete<Detector>_>::~unique_ptr
            ((unique_ptr<Detector,_std::default_delete<Detector>_> *)&_argv);
  local_48 = "";
  pDVar5 = std::unique_ptr<Detector,_std::default_delete<Detector>_>::operator->(&this->_det);
  (*(code *)**(undefined8 **)pDVar5)(pDVar5,1,&local_48,callback,0);
  std::operator<<((ostream *)&std::cout,"init_done\n");
  return;
}

Assistant:

explicit DetectorOutput(const char* detector) {
    if (!_libdetector->load(detector)) {
      throw std::runtime_error("could not load library");
    }
    decltype(CreateDetector)* create_detector =
        (*_libdetector)["CreateDetector"];
    if (nullptr == create_detector) {
      throw std::runtime_error("could not bind detector");
    }
    _det = std::unique_ptr<Detector>(create_detector());

    const char* _argv = "";
    _det->init(1, &_argv, callback, nullptr);

    std::cout << "init_done\n";
  }